

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O2

void __thiscall
boost::xpressive::cpp_regex_traits<char>::cpp_regex_traits
          (cpp_regex_traits<char> *this,locale_type *loc)

{
  locale local_30 [8];
  
  memset(this,0,0x200);
  std::locale::locale(&this->loc_);
  std::locale::locale(local_30,loc);
  imbue((cpp_regex_traits<char> *)&stack0xffffffffffffffd8,(locale_type *)this);
  std::locale::~locale((locale *)&stack0xffffffffffffffd8);
  std::locale::~locale(local_30);
  return;
}

Assistant:

cpp_regex_traits(locale_type const &loc = locale_type())
      : base_type()
      , loc_()
    {
        this->imbue(loc);
    }